

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O3

void __thiscall ON_PolyEdgeSegment::ClearEvalCacheHelper(ON_PolyEdgeSegment *this)

{
  double dVar1;
  
  this->m_t = -1.23432101234321e+308;
  this->m_edge_t = -1.23432101234321e+308;
  this->m_trim_t = -1.23432101234321e+308;
  this->m_srf_uv[0] = -1.23432101234321e+308;
  this->m_srf_uv[1] = -1.23432101234321e+308;
  this->m_trim_hint = 0;
  this->m_edge_hint = 0;
  this->m_evsrf_hint[0] = 0;
  this->m_evsrf_hint[1] = 0;
  this->m_evsrf_uv[0] = -1.23432101234321e+308;
  this->m_evsrf_uv[1] = -1.23432101234321e+308;
  dVar1 = ON_3dPoint::UnsetPoint.y;
  (this->m_evsrf_pt).x = ON_3dPoint::UnsetPoint.x;
  (this->m_evsrf_pt).y = dVar1;
  (this->m_evsrf_pt).z = ON_3dPoint::UnsetPoint.z;
  return;
}

Assistant:

void ON_PolyEdgeSegment::ClearEvalCacheHelper()
{
  m_t = ON_UNSET_VALUE;
  m_edge_t = ON_UNSET_VALUE;
  m_trim_t = ON_UNSET_VALUE;
  m_srf_uv[0] = ON_UNSET_VALUE;
  m_srf_uv[1] = ON_UNSET_VALUE;
  m_trim_hint = 0;
  m_edge_hint = 0;
  m_evsrf_hint[0] = 0;
  m_evsrf_hint[1] = 0;
  m_evsrf_uv[0] = ON_UNSET_VALUE;
  m_evsrf_uv[1] = ON_UNSET_VALUE;
  m_evsrf_pt = ON_3dPoint::UnsetPoint;
}